

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateInfo.cpp
# Opt level: O0

int helics::getOptionValue(string *val)

{
  bool bVar1;
  unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_28UL,_frozen::elsa<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *this;
  unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_28UL,_frozen::elsa<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *puVar2;
  const_iterator pvVar3;
  const_iterator pvVar4;
  pointer pvVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  const_iterator fnd;
  value_type *fnd2;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *in_stack_ffffffffffffffa8;
  unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_28UL,_frozen::elsa<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *in_stack_ffffffffffffffc0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  local_38;
  string *in_stack_ffffffffffffffd0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  local_28;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  local_20;
  unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_28UL,_frozen::elsa<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *local_18;
  int local_4;
  
  this = (unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_28UL,_frozen::elsa<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          *)frozen::
            unordered_map<std::basic_string_view<char,std::char_traits<char>>,int,28ul,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>
            ::find<std::__cxx11::string>(in_stack_ffffffffffffffc0,in_RDI);
  local_18 = this;
  puVar2 = (unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_28UL,_frozen::elsa<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            *)frozen::
              unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_28UL,_frozen::elsa<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              ::end((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_28UL,_frozen::elsa<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     *)0x3fcbe8);
  if (this == puVar2) {
    local_20._M_cur =
         (__node_type *)
         CLI::std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
         ::find(in_stack_ffffffffffffffa8,(key_type *)0x3fcc17);
    local_28._M_cur =
         (__node_type *)
         CLI::std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
         ::end(in_stack_ffffffffffffffa8);
    bVar1 = CLI::std::__detail::operator==(&local_20,&local_28);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      gmlc::utilities::makeLowerCase(in_stack_ffffffffffffffd0);
      pvVar3 = frozen::
               unordered_map<std::basic_string_view<char,std::char_traits<char>>,int,28ul,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>
               ::find<std::__cxx11::string>(this,in_RDI);
      local_18 = (unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_28UL,_frozen::elsa<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  *)pvVar3;
      pvVar4 = frozen::
               unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_28UL,_frozen::elsa<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               ::end((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_28UL,_frozen::elsa<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      *)0x3fcc90);
      if (pvVar3 == pvVar4) {
        local_20._M_cur =
             (__node_type *)
             CLI::std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::find(in_stack_ffffffffffffffa8,(key_type *)0x3fccbc);
        local_38._M_cur =
             (__node_type *)
             CLI::std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::end(in_stack_ffffffffffffffa8);
        bVar1 = CLI::std::__detail::operator==(&local_20,&local_38);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          local_4 = -0x65;
        }
        else {
          pvVar5 = CLI::std::__detail::
                   _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>
                   ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>
                                 *)0x3fccfd);
          local_4 = pvVar5->second;
        }
      }
      else {
        local_4 = *(int *)((long)local_18 + 0x10);
      }
    }
    else {
      pvVar5 = CLI::std::__detail::
               _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>
               ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>
                             *)0x3fcc4e);
      local_4 = pvVar5->second;
    }
  }
  else {
    local_4 = *(int *)&(local_18->items_).data_[0].first._M_str;
  }
  return local_4;
}

Assistant:

int getOptionValue(std::string val)
{
    const auto* fnd2 = option_value_map.find(val);
    if (fnd2 != option_value_map.end()) {
        return fnd2->second;
    }
    auto fnd = log_level_map.find(val);
    if (fnd != log_level_map.end()) {
        return fnd->second;
    }
    gmlc::utilities::makeLowerCase(val);
    fnd2 = option_value_map.find(val);
    if (fnd2 != option_value_map.end()) {
        return fnd2->second;
    }
    fnd = log_level_map.find(val);
    if (fnd != log_level_map.end()) {
        return fnd->second;
    }
    return HELICS_INVALID_OPTION_INDEX;
}